

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateType.cpp
# Opt level: O0

KBOOL __thiscall KDIS::DATA_TYPE::AggregateType::operator<(AggregateType *this,AggregateType *Value)

{
  KUINT64 ui64OtherCmpVal;
  KUINT64 ui64ThisCmpVal;
  AggregateType *Value_local;
  AggregateType *this_local;
  
  return ((ulong)this->m_ui8Kind << 0x38 | (ulong)this->m_ui8Domain << 0x30 |
          (ulong)this->m_ui16Country << 0x20 | (ulong)this->m_ui8Category << 0x18 |
          (ulong)this->m_ui8SubCategory << 0x10 | (ulong)this->m_ui8Specific << 8 |
         (ulong)this->m_ui8Extra) <
         ((ulong)Value->m_ui8Kind << 0x38 | (ulong)Value->m_ui8Domain << 0x30 |
          (ulong)Value->m_ui16Country << 0x20 | (ulong)Value->m_ui8Category << 0x18 |
          (ulong)Value->m_ui8SubCategory << 0x10 | (ulong)Value->m_ui8Specific << 8 |
         (ulong)Value->m_ui8Extra);
}

Assistant:

KBOOL AggregateType::operator < ( const AggregateType & Value ) const
{
    // We will bit shift all 7 fields into a single KUINT64, this will generate a new unique value which we can then use for comparison.
    // bits 56-63 = Kind
    // bits 48-55 = Domain
    // bits 32-47 = Country
    // bits 24-31 = Category
    // bits 16-23 = SubCategory
    // bits 8-15  = Specific
    // bits 0-7   = Extra
    KUINT64 ui64ThisCmpVal = 0, ui64OtherCmpVal = 0;

    ui64ThisCmpVal = ( KUINT64 )m_ui8Kind << 56 | ( KUINT64 )m_ui8Domain << 48 | ( KUINT64 )m_ui16Country << 32 | ( KUINT64 )m_ui8Category << 24 | ( KUINT64 )m_ui8SubCategory << 16 | ( KUINT64 )m_ui8Specific << 8 | ( KUINT64 )m_ui8Extra;

    ui64OtherCmpVal = ( KUINT64 )Value.m_ui8Kind << 56 | ( KUINT64 )Value.m_ui8Domain << 48 | ( KUINT64 )Value.m_ui16Country << 32 | ( KUINT64 )Value.m_ui8Category << 24 | ( KUINT64 )Value.m_ui8SubCategory << 16 | ( KUINT64 )Value.m_ui8Specific << 8 | ( KUINT64 )Value.m_ui8Extra;

    return ui64ThisCmpVal < ui64OtherCmpVal;
}